

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowTerminalType::~IfcFlowTerminalType(IfcFlowTerminalType *this)

{
  IfcElementType::~IfcElementType((IfcElementType *)this,&PTR_construction_vtable_24__00742ee0);
  return;
}

Assistant:

IfcFlowTerminalType() : Object("IfcFlowTerminalType") {}